

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Type * __thiscall soul::heart::StructElement::getType(StructElement *this)

{
  Structure *this_00;
  Member *pMVar1;
  string_view memberName;
  
  this_00 = getStruct(this);
  memberName._M_str = (this->memberName)._M_dataplus._M_p;
  memberName._M_len = (this->memberName)._M_string_length;
  pMVar1 = Structure::getMemberWithName(this_00,memberName);
  return &pMVar1->type;
}

Assistant:

const Type& getType() const override            { return getStruct().getMemberWithName (memberName).type; }